

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  uv_timer_t *loop_00;
  int extraout_EDX;
  char *pcVar6;
  void *unaff_RBP;
  int iVar7;
  uv_stream_t *handle;
  uv_process_t *puVar8;
  uv_timer_t *puVar9;
  code *pcVar10;
  uv_process_options_t *unaff_R14;
  void *unaff_R15;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio [3];
  uv_os_fd_t uStackY_824;
  sockaddr_in sStackY_820;
  uv_stdio_container_t uStackY_810;
  undefined4 uStackY_800;
  undefined4 uStackY_7f8;
  undefined4 uStackY_7f0;
  undefined4 uStackY_7e8;
  undefined4 uStackY_7e0;
  int iStackY_7d8;
  uv_loop_t *puStackY_7d0;
  uv_tcp_t uStackY_7c8;
  uv_stdio_container_t uStackY_6d0;
  undefined4 uStackY_6c0;
  undefined4 uStackY_6b0;
  undefined4 uStackY_6a0;
  uv_loop_t *puStackY_698;
  undefined1 auStackY_688 [272];
  anon_union_8_2_26168aa3_for_data aStackY_578;
  code *pcStackY_570;
  code *pcStackY_568;
  void *pvStackY_560;
  undefined1 auStackY_558 [40];
  uv_stdio_container_t uStackY_530;
  int iStackY_520;
  uv_handle_type *puStackY_518;
  uv_stream_t uStackY_510;
  uv_handle_type auStackY_408 [66];
  undefined1 auStackY_300 [200];
  uv_fs_t *puStackY_238;
  code *pcStackY_230;
  undefined1 local_220 [456];
  uv_stdio_container_t local_58;
  undefined4 local_48;
  uint local_40;
  undefined4 local_38;
  uint local_30;
  
  pcVar6 = "stdout_file";
  pcStackY_230 = (code *)0x17754f;
  unlink("stdout_file");
  pcStackY_230 = (code *)0x17755b;
  unlink("stderr_file");
  pcStackY_230 = (code *)0x17756e;
  init_process_options("spawn_helper6",exit_cb);
  pcStackY_230 = (code *)0x17758b;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(local_220 + 0x10),"stdout_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    pcStackY_230 = (code *)0x17783c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0017783c:
    pcStackY_230 = (code *)0x177841;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_00177841:
    pcStackY_230 = (code *)0x177846;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_00177846:
    pcStackY_230 = (code *)0x17784b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0017784b:
    pcStackY_230 = (code *)0x177850;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_00177850:
    pcStackY_230 = (code *)0x177855;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_00177855:
    pcStackY_230 = (code *)0x17785a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0017785a:
    pcStackY_230 = (code *)0x17785f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0017785f:
    pcStackY_230 = (code *)0x177864;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_00177864:
    pcStackY_230 = (code *)0x177869;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_00177869:
    pcStackY_230 = (code *)0x17786e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0017786e:
    pcStackY_230 = (code *)0x177873;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_00177873:
    pcStackY_230 = (code *)0x177878;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_00177878:
    pcStackY_230 = (code *)0x17787d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    pcStackY_230 = (code *)0x1775a0;
    uv_fs_req_cleanup((uv_fs_t *)(local_220 + 0x10));
    pcStackY_230 = (code *)0x1775ac;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0017783c;
    unaff_RBP = (void *)(ulong)uVar1;
    pcStackY_230 = (code *)0x1775d8;
    uVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(local_220 + 0x10),"stderr_file",0x42,0x180,
                       (uv_fs_cb)0x0);
    if (uVar2 == 0xffffffff) goto LAB_00177841;
    pcVar6 = (char *)(ulong)uVar2;
    pcStackY_230 = (code *)0x1775ed;
    uv_fs_req_cleanup((uv_fs_t *)(local_220 + 0x10));
    unaff_R15 = (void *)0x2;
    pcStackY_230 = (code *)0x1775ff;
    uVar2 = dup2(uVar2,2);
    if (uVar2 == 0xffffffff) goto LAB_00177846;
    pcVar6 = (char *)(ulong)uVar2;
    options.stdio = &local_58;
    unaff_R14 = &options;
    local_58.flags = UV_IGNORE;
    local_48 = 2;
    local_38 = 2;
    options.stdio_count = 3;
    pcStackY_230 = (code *)0x177643;
    local_40 = uVar2;
    local_30 = uVar1;
    puVar4 = uv_default_loop();
    pcStackY_230 = (code *)0x177655;
    iVar3 = uv_spawn(puVar4,&process,&options);
    if (iVar3 != 0) goto LAB_0017784b;
    pcStackY_230 = (code *)0x177662;
    puVar4 = uv_default_loop();
    pcStackY_230 = (code *)0x17766c;
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177850;
    if (exit_cb_called != 1) goto LAB_00177855;
    if (close_cb_called != 1) goto LAB_0017785a;
    pcStackY_230 = (code *)0x17769f;
    local_220._0_16_ = (undefined1  [16])uv_buf_init(output,0x400);
    pcStackY_230 = (code *)0x1776ca;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)(local_220 + 0x10),uVar1,(uv_buf_t *)local_220,1,
                       0,(uv_fs_cb)0x0);
    if (iVar3 < 0xf) goto LAB_0017785f;
    unaff_R14 = (uv_process_options_t *)(local_220 + 0x10);
    pcStackY_230 = (code *)0x1776e0;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_230 = (code *)0x1776ee;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00177864;
    pcStackY_230 = (code *)0x177700;
    uv_fs_req_cleanup((uv_fs_t *)(local_220 + 0x10));
    pcStackY_230 = (code *)0x177715;
    printf("output is: %s",output);
    if (CONCAT35(output._12_3_,CONCAT41(output._8_4_,output[7])) != 0xa646c726f777272 ||
        CONCAT17(output[7],output._0_7_) != 0x7265206f6c6c6568) goto LAB_00177869;
    pcStackY_230 = (code *)0x177764;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)(local_220 + 0x10),uVar2,(uv_buf_t *)local_220,1,
                       0,(uv_fs_cb)0x0);
    if (iVar3 < 0xc) goto LAB_0017786e;
    unaff_R14 = (uv_process_options_t *)(local_220 + 0x10);
    pcStackY_230 = (code *)0x17777a;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_230 = (code *)0x177788;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar2,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00177873;
    pcStackY_230 = (code *)0x17779a;
    uv_fs_req_cleanup((uv_fs_t *)(local_220 + 0x10));
    pcStackY_230 = (code *)0x1777af;
    printf("output is: %s",output);
    if (output._8_4_ != 0xa646c72 || CONCAT17(output[7],output._0_7_) != 0x6f77206f6c6c6568)
    goto LAB_00177878;
    pcStackY_230 = (code *)0x1777e2;
    unlink("stdout_file");
    pcStackY_230 = (code *)0x1777ee;
    unlink("stderr_file");
    pcStackY_230 = (code *)0x1777f3;
    pcVar6 = (char *)uv_default_loop();
    pcStackY_230 = (code *)0x177807;
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    pcStackY_230 = (code *)0x177811;
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    pcStackY_230 = (code *)0x177816;
    puVar4 = uv_default_loop();
    pcStackY_230 = (code *)0x17781e;
    iVar3 = uv_loop_close(puVar4);
    if (iVar3 == 0) {
      pcStackY_230 = (code *)0x177827;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStackY_230 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  loop = (uv_loop_t *)&pvStackY_560;
  pvStackY_560 = (void *)0x72662d6f6c6c6568;
  auStackY_558._0_7_ = 0x776170732d6d6f;
  auStackY_558[7] = 'n';
  auStackY_558._8_7_ = 0x6e696474735f;
  pcStackY_568 = (code *)0x1778bb;
  auStackY_300._192_8_ = pcVar6;
  puStackY_238 = (uv_fs_t *)unaff_R14;
  pcStackY_230 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStackY_568 = (code *)0x1778c0;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)&(&uStackY_510)[1].type;
  pcStackY_568 = (code *)0x1778d5;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  pcStackY_568 = (code *)0x1778da;
  puVar5 = uv_default_loop();
  pcStackY_568 = (code *)0x1778ec;
  uv_pipe_init(puVar5,(uv_pipe_t *)&uStackY_510,0);
  options.stdio = &uStackY_530;
  uStackY_530.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  iStackY_520 = 0x21;
  options.stdio_count = 2;
  pcStackY_568 = (code *)0x177923;
  uStackY_530.data.stream = &uStackY_510;
  puStackY_518 = (uv_handle_type *)puVar4;
  puVar5 = uv_default_loop();
  iVar7 = 0x34b410;
  pcStackY_568 = (code *)0x177935;
  iVar3 = uv_spawn(puVar5,&process,&options);
  if (iVar3 == 0) {
    auStackY_558._32_8_ = (void *)0x17;
    puVar5 = (uv_loop_t *)auStackY_300;
    handle = &uStackY_510;
    pcStackY_568 = (code *)0x17796e;
    auStackY_558._24_8_ = &pvStackY_560;
    iVar3 = uv_write((uv_write_t *)puVar5,handle,(uv_buf_t *)(auStackY_558 + 0x18),1,write_cb);
    iVar7 = (int)handle;
    if (iVar3 != 0) goto LAB_00177a1e;
    iVar7 = 0x176e97;
    puVar5 = (uv_loop_t *)&(&uStackY_510)[1].type;
    pcStackY_568 = (code *)0x177991;
    iVar3 = uv_read_start((uv_stream_t *)puVar5,on_alloc,on_read);
    if (iVar3 != 0) goto LAB_00177a23;
    pcStackY_568 = (code *)0x17799e;
    puVar5 = uv_default_loop();
    iVar7 = 0;
    pcStackY_568 = (code *)0x1779a8;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177a28;
    if (exit_cb_called != 1) goto LAB_00177a2d;
    if (close_cb_called != 3) goto LAB_00177a32;
    iVar7 = 0x34b4a0;
    pcStackY_568 = (code *)0x1779cd;
    iVar3 = strcmp((char *)&pvStackY_560,output);
    if (iVar3 != 0) goto LAB_00177a37;
    pcStackY_568 = (code *)0x1779d6;
    puVar4 = uv_default_loop();
    pcStackY_568 = (code *)0x1779ea;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar7 = 0;
    pcStackY_568 = (code *)0x1779f4;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_568 = (code *)0x1779f9;
    loop = uv_default_loop();
    pcStackY_568 = (code *)0x177a01;
    iVar3 = uv_loop_close(loop);
    if (iVar3 == 0) {
      pcStackY_568 = (code *)0x177a0a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStackY_568 = (code *)0x177a1e;
    run_test_spawn_stdin_cold_1();
LAB_00177a1e:
    pcStackY_568 = (code *)0x177a23;
    run_test_spawn_stdin_cold_2();
LAB_00177a23:
    pcStackY_568 = (code *)0x177a28;
    run_test_spawn_stdin_cold_3();
LAB_00177a28:
    pcStackY_568 = (code *)0x177a2d;
    run_test_spawn_stdin_cold_4();
LAB_00177a2d:
    pcStackY_568 = (code *)0x177a32;
    run_test_spawn_stdin_cold_5();
LAB_00177a32:
    loop = puVar5;
    pcStackY_568 = (code *)0x177a37;
    run_test_spawn_stdin_cold_6();
LAB_00177a37:
    pcStackY_568 = (code *)0x177a3c;
    run_test_spawn_stdin_cold_7();
  }
  pcStackY_568 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar7 == 0) {
    uv_close((uv_handle_t *)loop->pending_queue[1],close_cb);
    return extraout_EAX;
  }
  pcStackY_570 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_7c8.queued_fds = (void *)0x177a79;
  auStackY_688._264_8_ = puVar4;
  aStackY_578.stream = &uStackY_510;
  pcStackY_570 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_7c8.queued_fds = (void *)0x177a7e;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)auStackY_688;
  uStackY_7c8.queued_fds = (void *)0x177a92;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  uStackY_6d0.flags = UV_IGNORE;
  uStackY_6c0 = 0;
  uStackY_6b0 = 0;
  uStackY_6a0 = 0x21;
  options.stdio_count = 4;
  uStackY_7c8.queued_fds = (void *)0x177ac5;
  options.stdio = &uStackY_6d0;
  puStackY_698 = puVar4;
  puVar5 = uv_default_loop();
  uStackY_7c8.queued_fds = (void *)0x177ad7;
  iVar3 = uv_spawn(puVar5,&process,&options);
  if (iVar3 == 0) {
    uStackY_7c8.queued_fds = (void *)0x177af7;
    iVar3 = uv_read_start((uv_stream_t *)auStackY_688,on_alloc,on_read);
    if (iVar3 != 0) goto LAB_00177bb8;
    uStackY_7c8.queued_fds = (void *)0x177b04;
    puVar5 = uv_default_loop();
    uStackY_7c8.queued_fds = (void *)0x177b0e;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177bbd;
    if (exit_cb_called != 1) goto LAB_00177bc2;
    if (close_cb_called != 2) goto LAB_00177bc7;
    uStackY_7c8.queued_fds = (void *)0x177b45;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT35(output._12_3_,CONCAT41(output._8_4_,output[7])) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_00177bcc;
    uStackY_7c8.queued_fds = (void *)0x177b71;
    puVar4 = uv_default_loop();
    uStackY_7c8.queued_fds = (void *)0x177b85;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uStackY_7c8.queued_fds = (void *)0x177b8f;
    uv_run(puVar4,UV_RUN_DEFAULT);
    uStackY_7c8.queued_fds = (void *)0x177b94;
    puVar5 = uv_default_loop();
    uStackY_7c8.queued_fds = (void *)0x177b9c;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      uStackY_7c8.queued_fds = (void *)0x177ba5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_7c8.queued_fds = (void *)0x177bb8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_00177bb8:
    uStackY_7c8.queued_fds = (void *)0x177bbd;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_00177bbd:
    uStackY_7c8.queued_fds = (void *)0x177bc2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_00177bc2:
    uStackY_7c8.queued_fds = (void *)0x177bc7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_00177bc7:
    uStackY_7c8.queued_fds = (void *)0x177bcc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_00177bcc:
    uStackY_7c8.queued_fds = (void *)0x177bd1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_7c8.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_7d0 = (uv_loop_t *)0x177be2;
  puVar5 = uv_default_loop();
  puStackY_7d0 = (uv_loop_t *)0x177bed;
  iVar3 = uv_tcp_init(puVar5,&uStackY_7c8);
  if (iVar3 == 0) {
    puStackY_7d0 = (uv_loop_t *)0x177bfe;
    iVar3 = uv_tcp_open(&uStackY_7c8,3);
    if (iVar3 != 0) goto LAB_00177c27;
    puStackY_7d0 = (uv_loop_t *)0x177c11;
    iVar3 = uv_listen((uv_stream_t *)&uStackY_7c8,0x1000,(uv_connection_cb)0x0);
    if (iVar3 == 0) {
      return 1;
    }
  }
  else {
    puStackY_7d0 = (uv_loop_t *)0x177c27;
    spawn_tcp_server_helper_cold_1();
LAB_00177c27:
    puStackY_7d0 = (uv_loop_t *)0x177c2c;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_7d0 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_7d0 = puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_820);
  if (iVar3 == 0) {
    uStackY_824 = -1;
    puVar4 = uv_default_loop();
    iVar3 = uv_tcp_init_ex(puVar4,&tcp_server,2);
    if (iVar3 != 0) goto LAB_00177d97;
    iVar3 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_820,0);
    if (iVar3 != 0) goto LAB_00177d9c;
    iVar3 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_824);
    if (iVar3 != 0) goto LAB_00177da1;
    if (uStackY_824 < 1) goto LAB_00177da6;
    options.stdio = &uStackY_810;
    uStackY_810.flags = UV_INHERIT_FD;
    uStackY_810.data.fd = 0;
    uStackY_800 = 2;
    uStackY_7f8 = 1;
    uStackY_7f0 = 2;
    uStackY_7e8 = 2;
    uStackY_7e0 = 2;
    iStackY_7d8 = uStackY_824;
    options.stdio_count = 4;
    puVar4 = uv_default_loop();
    iVar3 = uv_spawn(puVar4,&process,&options);
    if (iVar3 != 0) goto LAB_00177dab;
    puVar4 = uv_default_loop();
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177db0;
    if (exit_cb_called != 1) goto LAB_00177db5;
    if (close_cb_called != 1) goto LAB_00177dba;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar3 = uv_loop_close(puVar4);
    if (iVar3 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_00177d97:
    run_test_spawn_tcp_server_cold_2();
LAB_00177d9c:
    run_test_spawn_tcp_server_cold_3();
LAB_00177da1:
    run_test_spawn_tcp_server_cold_4();
LAB_00177da6:
    run_test_spawn_tcp_server_cold_5();
LAB_00177dab:
    run_test_spawn_tcp_server_cold_6();
LAB_00177db0:
    run_test_spawn_tcp_server_cold_7();
LAB_00177db5:
    run_test_spawn_tcp_server_cold_8();
LAB_00177dba:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar4 = uv_default_loop();
  iVar3 = uv_spawn(puVar4,&process,&options);
  if (iVar3 == 0) {
    puVar4 = uv_default_loop();
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177e76;
    if (exit_cb_called != 1) goto LAB_00177e7b;
    if (close_cb_called != 1) goto LAB_00177e80;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar3 = uv_loop_close(puVar4);
    if (iVar3 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_00177e76:
    run_test_spawn_ignored_stdio_cold_2();
LAB_00177e7b:
    run_test_spawn_ignored_stdio_cold_3();
LAB_00177e80:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop_00 = (uv_timer_t *)uv_default_loop();
  puVar8 = &process;
  iVar3 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
  if (iVar3 == 0) {
    loop_00 = (uv_timer_t *)uv_default_loop();
    puVar9 = &timer;
    iVar3 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    pcVar10 = (code *)puVar9;
    if (iVar3 != 0) goto LAB_00177f62;
    loop_00 = &timer;
    pcVar10 = timer_cb;
    iVar3 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar3 != 0) goto LAB_00177f67;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcVar10 = (code *)0x0;
    iVar3 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00177f6c;
    if (exit_cb_called != 1) goto LAB_00177f71;
    if (close_cb_called != 2) goto LAB_00177f76;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcVar10 = (code *)0x0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    loop_00 = (uv_timer_t *)uv_default_loop();
    iVar3 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar3 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar10 = (code *)puVar8;
LAB_00177f62:
    run_test_spawn_and_kill_cold_2();
LAB_00177f67:
    run_test_spawn_and_kill_cold_3();
LAB_00177f6c:
    run_test_spawn_and_kill_cold_4();
LAB_00177f71:
    run_test_spawn_and_kill_cold_5();
LAB_00177f76:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar6 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar10 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      pcVar6 = (char *)(ulong)*(uint *)&((uv_loop_t *)loop_00)->watchers;
      iVar3 = uv_kill(*(uint *)&((uv_loop_t *)loop_00)->watchers,0);
      if (iVar3 == -3) {
        return -3;
      }
      goto LAB_00177fd5;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_00177fd5:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)pcVar6,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_file stdout_file;
  uv_file stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(r, STDOUT_FILENO);
  ASSERT(stdout_file != -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(r, STDERR_FILENO);
  ASSERT(stderr_file != -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT(r >= 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello errworld\n", output, 15) == 0);

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT(r >= 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello world\n", output, 12) == 0);

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}